

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram.c
# Opt level: O1

CURLcode Curl_auth_decode_cram_md5_message(char *chlg64,char **outptr,size_t *outlen)

{
  char cVar1;
  bool bVar2;
  uchar uVar3;
  CURLcode CVar4;
  size_t sVar5;
  uchar *puVar6;
  long lVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  char cVar13;
  ulong uVar14;
  size_t sVar15;
  uchar *puVar16;
  
  cVar1 = *chlg64;
  *outptr = (char *)0x0;
  *outlen = 0;
  if ((cVar1 == '\0') || (*chlg64 == '=')) {
    return CURLE_OK;
  }
  *outptr = (char *)0x0;
  *outlen = 0;
  sVar5 = strlen(chlg64);
  CVar4 = CURLE_BAD_CONTENT_ENCODING;
  if ((sVar5 & 3) == 0 && sVar5 != 0) {
    for (lVar11 = 0; chlg64[lVar11] != '\0'; lVar11 = lVar11 + 1) {
      if (chlg64[lVar11] == '=') {
        lVar7 = (ulong)(chlg64[lVar11 + 1] == '=') + 1;
        goto LAB_0010acfc;
      }
    }
    lVar7 = 0;
LAB_0010acfc:
    if (sVar5 - lVar7 == lVar11) {
      uVar14 = sVar5 >> 2;
      sVar15 = uVar14 * 3 - lVar7;
      puVar6 = (uchar *)(*Curl_cmalloc)(sVar15 + 1);
      if (puVar6 == (uchar *)0x0) {
        CVar4 = CURLE_OUT_OF_MEMORY;
      }
      else {
        lVar11 = 0;
        puVar16 = puVar6;
        do {
          uVar9 = 0;
          lVar7 = 0;
          uVar10 = 0;
          pcVar8 = chlg64;
          do {
            cVar1 = *pcVar8;
            if (cVar1 == '=') {
              uVar9 = uVar9 << 6;
              uVar10 = uVar10 + 1;
LAB_0010ada3:
              bVar2 = true;
            }
            else {
              lVar12 = 0;
              if (cVar1 == 'A') {
                cVar13 = 'A';
              }
              else {
                do {
                  cVar13 = "ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz0123456789+/"
                           [lVar12 + 1];
                  lVar12 = lVar12 + 1;
                  if (cVar13 == '\0') break;
                } while (cVar13 != cVar1);
              }
              if (cVar13 == cVar1) {
                uVar9 = uVar9 * 0x40 + lVar12;
                goto LAB_0010ada3;
              }
              bVar2 = false;
            }
            if (!bVar2) {
              lVar7 = 0;
              goto LAB_0010adfc;
            }
            lVar7 = lVar7 + 1;
            pcVar8 = pcVar8 + 1;
          } while (lVar7 != 4);
          if (uVar10 == 0) {
            uVar3 = curlx_ultouc(uVar9 & 0xff);
            puVar16[2] = uVar3;
          }
          if (uVar10 < 2) {
            uVar3 = curlx_ultouc(uVar9 >> 8 & 0xff);
            puVar16[1] = uVar3;
          }
          uVar3 = curlx_ultouc((ulong)((uint)uVar9 >> 0x10 & 0xff));
          *puVar16 = uVar3;
          lVar7 = 3 - uVar10;
LAB_0010adfc:
          if (lVar7 == 0) {
            (*Curl_cfree)(puVar6);
            return CURLE_BAD_CONTENT_ENCODING;
          }
          puVar16 = puVar16 + lVar7;
          chlg64 = chlg64 + 4;
          lVar11 = lVar11 + 1;
        } while (lVar11 != uVar14 + (uVar14 == 0));
        *puVar16 = '\0';
        *outptr = (char *)puVar6;
        *outlen = sVar15;
        CVar4 = CURLE_OK;
      }
    }
  }
  return CVar4;
}

Assistant:

CURLcode Curl_auth_decode_cram_md5_message(const char *chlg64, char **outptr,
                                           size_t *outlen)
{
  CURLcode result = CURLE_OK;
  size_t chlg64len = strlen(chlg64);

  *outptr = NULL;
  *outlen = 0;

  /* Decode the challenge if necessary */
  if(chlg64len && *chlg64 != '=')
    result = Curl_base64_decode(chlg64, (unsigned char **) outptr, outlen);

  return result;
}